

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O2

int mu_begin_window_ex(mu_Context *ctx,char *title,mu_Rect rect,int opt)

{
  mu_Rect *pmVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  mu_Vec2 mVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ulong uVar9;
  mu_Id mVar10;
  int iVar11;
  size_t sVar12;
  mu_Container *cnt;
  long lVar13;
  mu_Command *pmVar14;
  undefined8 uVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  mu_Rect mVar22;
  mu_Rect rect_00;
  mu_Rect rect_01;
  mu_Rect rect_02;
  mu_Rect body;
  mu_Rect rect_03;
  int local_50;
  
  sVar12 = strlen(title);
  mVar10 = mu_get_id(ctx,title,(int)sVar12);
  pmVar14 = (mu_Command *)(ulong)mVar10;
  cnt = get_container(ctx,mVar10,opt);
  if ((cnt == (mu_Container *)0x0) || (cnt->open == 0)) {
    return 0;
  }
  lVar13 = (long)(ctx->id_stack).idx;
  if (lVar13 < 0x20) {
    (ctx->id_stack).items[lVar13] = mVar10;
    (ctx->id_stack).idx = (ctx->id_stack).idx + 1;
    if ((((uint)opt >> 0xd & 1) != 0) || ((cnt->rect).w == 0)) {
      (cnt->rect).x = (int)rect._0_8_;
      (cnt->rect).y = (int)((ulong)rect._0_8_ >> 0x20);
      (cnt->rect).w = (int)rect._8_8_;
      (cnt->rect).h = (int)((ulong)rect._8_8_ >> 0x20);
    }
    iVar11 = (ctx->container_stack).idx;
    if ((long)iVar11 < 0x20) {
      (ctx->container_stack).items[iVar11] = cnt;
      (ctx->container_stack).idx = iVar11 + 1;
      iVar11 = (ctx->root_list).idx;
      if ((long)iVar11 < 0x20) {
        (ctx->root_list).items[iVar11] = cnt;
        (ctx->root_list).idx = iVar11 + 1;
        pmVar14 = push_jump(ctx,pmVar14);
        cnt->head = pmVar14;
        iVar11 = rect_overlaps_vec2(cnt->rect,ctx->mouse_pos);
        if ((iVar11 != 0) &&
           ((ctx->next_hover_root == (mu_Container *)0x0 ||
            (ctx->next_hover_root->zindex < cnt->zindex)))) {
          ctx->next_hover_root = cnt;
        }
        lVar13 = (long)(ctx->clip_stack).idx;
        if (lVar13 < 0x20) {
          (ctx->clip_stack).items[lVar13] = unclipped_rect;
          (ctx->clip_stack).idx = (ctx->clip_stack).idx + 1;
          pmVar1 = &cnt->rect;
          uVar21._0_4_ = pmVar1->x;
          uVar21._4_4_ = pmVar1->y;
          uVar9._0_4_ = (cnt->rect).w;
          uVar9._4_4_ = (cnt->rect).h;
          uVar16 = uVar21 >> 0x20;
          if ((opt & 8U) == 0) {
            (*ctx->draw_frame)(ctx,*pmVar1,2);
          }
          uVar19 = uVar9;
          if (-1 < (char)opt) {
            iVar11 = ctx->style->title_height;
            rect_01.h = iVar11;
            rect_01.w = (undefined4)uVar9;
            mVar22.w = (undefined4)uVar9;
            mVar22.h = iVar11;
            mVar22.x = (undefined4)uVar21;
            mVar22.y = uVar21._4_4_;
            (*ctx->draw_frame)(ctx,mVar22,3);
            mVar10 = mu_get_id(ctx,"!title",6);
            rect_00.w = (undefined4)uVar9;
            rect_00.h = iVar11;
            rect_00.x = (undefined4)uVar21;
            rect_00.y = uVar21._4_4_;
            mu_update_control(ctx,mVar10,rect_00,opt);
            rect_01.x = (undefined4)uVar21;
            rect_01.y = uVar21._4_4_;
            mu_draw_control_text(ctx,title,rect_01,4,opt);
            if ((mVar10 == ctx->focus) && (ctx->mouse_down == 1)) {
              mVar5 = ctx->mouse_delta;
              uVar2 = (cnt->rect).x;
              uVar6 = (cnt->rect).y;
              (cnt->rect).x = uVar2 + mVar5.x;
              (cnt->rect).y = uVar6 + mVar5.y;
            }
            uVar16 = (ulong)(uint)(iVar11 + uVar21._4_4_);
            uVar19 = ((ulong)(uint)(uVar9._4_4_ - iVar11) << 0x20) + (uVar9 & 0xffffffff);
            if ((opt & 0x40U) == 0) {
              mVar10 = mu_get_id(ctx,"!close",6);
              uVar18 = (ulong)(uint)(((undefined4)uVar9 + (undefined4)uVar21) - iVar11) |
                       uVar21 & 0xffffffff00000000;
              mu_draw_icon(ctx,1,(mu_Rect)CONCAT88(CONCAT44(iVar11,iVar11),
                                                   CONCAT44((int)(uVar18 >> 0x20),(int)uVar18)),
                           ctx->style->colors[4]);
              rect_02.w = iVar11;
              rect_02.h = iVar11;
              rect_02.x = (int)uVar18;
              rect_02.y = (int)(uVar18 >> 0x20);
              mu_update_control(ctx,mVar10,rect_02,opt);
              if ((ctx->mouse_pressed == 1) && (mVar10 == ctx->focus)) {
                cnt->open = 0;
              }
            }
          }
          uVar16 = uVar16 << 0x20 | uVar21 & 0xffffffff;
          body.w = (int)uVar19;
          body.h = (int)(uVar19 >> 0x20);
          body.x = (int)uVar16;
          body.y = (int)(uVar16 >> 0x20);
          push_container_body(ctx,cnt,body,opt);
          if ((opt & 0x10U) == 0) {
            iVar11 = ctx->style->title_height;
            mVar10 = mu_get_id(ctx,"!resize",7);
            rect_03.x = ((undefined4)uVar9 + (undefined4)uVar21) - iVar11;
            rect_03.y = (uVar9._4_4_ + uVar21._4_4_) - iVar11;
            rect_03.h = iVar11;
            rect_03.w = iVar11;
            mu_update_control(ctx,mVar10,rect_03,opt);
            if ((mVar10 == ctx->focus) && (ctx->mouse_down == 1)) {
              uVar3 = (cnt->rect).w;
              uVar7 = (cnt->rect).h;
              iVar11 = (ctx->mouse_delta).x + uVar3;
              iVar20 = (ctx->mouse_delta).y + uVar7;
              uVar21 = CONCAT44(-(uint)(0x40 < iVar20),-(uint)(0x60 < iVar11));
              uVar21 = ~uVar21 & 0x4000000060 | CONCAT44(iVar20,iVar11) & uVar21;
              (cnt->rect).w = (int)uVar21;
              (cnt->rect).h = (int)(uVar21 >> 0x20);
            }
          }
          if (((uint)opt >> 9 & 1) != 0) {
            uVar15 = *(undefined8 *)
                      ((long)&ctx->id_stack + (long)(ctx->layout_stack).idx * 0x8c + 4);
            mVar5 = cnt->content_size;
            uVar4 = (cnt->rect).w;
            uVar8 = (cnt->rect).h;
            (cnt->rect).w = uVar4 + (mVar5.x - (int)uVar15);
            (cnt->rect).h = uVar8 + (mVar5.y - (int)((ulong)uVar15 >> 0x20));
          }
          if (((((uint)opt >> 10 & 1) != 0) && (ctx->mouse_pressed != 0)) &&
             (ctx->hover_root != cnt)) {
            cnt->open = 0;
          }
          mu_push_clip_rect(ctx,cnt->body);
          return 1;
        }
        pcVar17 = 
        "(ctx->clip_stack).idx < (int) (sizeof((ctx->clip_stack).items) / sizeof(*(ctx->clip_stack).items))"
        ;
        uVar15 = 0x42b;
      }
      else {
        pcVar17 = 
        "(ctx->root_list).idx < (int) (sizeof((ctx->root_list).items) / sizeof(*(ctx->root_list).items))"
        ;
        uVar15 = 0x41f;
      }
    }
    else {
      pcVar17 = 
      "(ctx->container_stack).idx < (int) (sizeof((ctx->container_stack).items) / sizeof(*(ctx->container_stack).items))"
      ;
      uVar15 = 0x41d;
    }
  }
  else {
    pcVar17 = 
    "(ctx->id_stack).idx < (int) (sizeof((ctx->id_stack).items) / sizeof(*(ctx->id_stack).items))";
    uVar15 = 0x440;
  }
  fprintf(_stderr,"Fatal error: %s:%d: assertion \'%s\' failed\n",
          "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/microui/microui.c"
          ,uVar15,pcVar17);
  abort();
}

Assistant:

int mu_begin_window_ex(mu_Context *ctx, const char *title, mu_Rect rect, int opt) {
  mu_Rect body;
  mu_Id id = mu_get_id(ctx, title, strlen(title));
  mu_Container *cnt = get_container(ctx, id, opt);
  if (!cnt || !cnt->open) { return 0; }
  push(ctx->id_stack, id);

  if (cnt->rect.w == 0 || opt & MU_OPT_FORCE_RESIZE) {
    cnt->rect = rect;
  }
  begin_root_container(ctx, cnt);
  rect = body = cnt->rect;

  /* draw frame */
  if (~opt & MU_OPT_NOFRAME) {
    ctx->draw_frame(ctx, rect, MU_COLOR_WINDOWBG);
  }

  /* do title bar */
  if (~opt & MU_OPT_NOTITLE) {
    mu_Rect tr = rect;
    tr.h = ctx->style->title_height;
    ctx->draw_frame(ctx, tr, MU_COLOR_TITLEBG);

    /* do title text */
    if (~opt & MU_OPT_NOTITLE) {
      mu_Id id = mu_get_id(ctx, "!title", 6);
      mu_update_control(ctx, id, tr, opt);
      mu_draw_control_text(ctx, title, tr, MU_COLOR_TITLETEXT, opt);
      if (id == ctx->focus && ctx->mouse_down == MU_MOUSE_LEFT) {
        cnt->rect.x += ctx->mouse_delta.x;
        cnt->rect.y += ctx->mouse_delta.y;
      }
      body.y += tr.h;
      body.h -= tr.h;
    }

    /* do `close` button */
    if (~opt & MU_OPT_NOCLOSE) {
      mu_Id id = mu_get_id(ctx, "!close", 6);
      mu_Rect r = mu_rect(tr.x + tr.w - tr.h, tr.y, tr.h, tr.h);
      tr.w -= r.w;
      mu_draw_icon(ctx, MU_ICON_CLOSE, r, ctx->style->colors[MU_COLOR_TITLETEXT]);
      mu_update_control(ctx, id, r, opt);
      if (ctx->mouse_pressed == MU_MOUSE_LEFT && id == ctx->focus) {
        cnt->open = 0;
      }
    }
  }

  push_container_body(ctx, cnt, body, opt);

  /* do `resize` handle */
  if (~opt & MU_OPT_NORESIZE) {
    int sz = ctx->style->title_height;
    mu_Id id = mu_get_id(ctx, "!resize", 7);
    mu_Rect r = mu_rect(rect.x + rect.w - sz, rect.y + rect.h - sz, sz, sz);
    mu_update_control(ctx, id, r, opt);
    if (id == ctx->focus && ctx->mouse_down == MU_MOUSE_LEFT) {
      cnt->rect.w = mu_max(96, cnt->rect.w + ctx->mouse_delta.x);
      cnt->rect.h = mu_max(64, cnt->rect.h + ctx->mouse_delta.y);
    }
  }

  /* resize to content size */
  if (opt & MU_OPT_AUTOSIZE) {
    mu_Rect r = get_layout(ctx)->body;
    cnt->rect.w = cnt->content_size.x + (cnt->rect.w - r.w);
    cnt->rect.h = cnt->content_size.y + (cnt->rect.h - r.h);
  }

  /* close if this is a popup window and elsewhere was clicked */
  if (opt & MU_OPT_POPUP && ctx->mouse_pressed && ctx->hover_root != cnt) {
    cnt->open = 0;
  }

  mu_push_clip_rect(ctx, cnt->body);
  return MU_RES_ACTIVE;
}